

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

void __thiscall
boost::detail::variant::destroyer::internal_visit<spartsi::ref_attribute>
          (destroyer *this,ref_attribute *operand,int param_2)

{
  pointer pcVar1;
  
  pcVar1 = (operand->ref_comment)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(operand->ref_comment).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (operand->comment)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(operand->comment).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (operand->value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(operand->value).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BOOST_VARIANT_AUX_RETURN_VOID_TYPE
    internal_visit(T& operand, int) const BOOST_NOEXCEPT
    {
        operand.~T(); // must be noexcept

#if BOOST_WORKAROUND(__BORLANDC__, BOOST_TESTED_AT(0x0551)) || \
    BOOST_WORKAROUND(BOOST_MSVC, BOOST_TESTED_AT(1600))
        operand; // suppresses warnings
#endif

        BOOST_VARIANT_AUX_RETURN_VOID;
    }